

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int addend0;
  png_fixed_point pVar13;
  png_xy xy;
  png_XYZ XYZtemp;
  png_XYZ local_a8;
  int local_7c;
  png_xy local_78;
  png_XYZ local_58;
  
  local_a8.blue_Z = XYZ_in->blue_Z;
  uVar6._0_4_ = XYZ_in->red_X;
  uVar6._4_4_ = XYZ_in->red_Y;
  local_a8.red_Z = XYZ_in->red_Z;
  local_a8.green_X = XYZ_in->green_X;
  uVar7._0_4_ = XYZ_in->green_Y;
  uVar7._4_4_ = XYZ_in->green_Z;
  uVar8._0_4_ = XYZ_in->blue_X;
  uVar8._4_4_ = XYZ_in->blue_Y;
  bVar2 = (int)(uVar6._4_4_ ^ 0x7fffffffU) < (png_fixed_point)uVar7;
  bVar3 = (int)((png_fixed_point)uVar7 ^ 0x7fffffffU) < uVar8._4_4_;
  iVar12 = uVar8._4_4_ + (png_fixed_point)uVar7;
  if (bVar3 || bVar2) {
    iVar12 = 0;
  }
  iVar11 = 1;
  local_a8._0_8_ = uVar6;
  local_a8._16_8_ = uVar7;
  local_a8._24_8_ = uVar8;
  local_7c = preferred;
  bVar9 = false;
  if (!bVar3 && !bVar2) {
    iVar12 = iVar12 + uVar6._4_4_;
    if (iVar12 == 100000) {
      iVar11 = 0;
      bVar9 = true;
    }
    else {
      iVar10 = 0;
      bVar9 = false;
      if (iVar12 != 0) {
        dVar5 = (double)iVar12;
        if ((png_fixed_point)uVar6 != 0) {
          dVar4 = floor(((double)(png_fixed_point)uVar6 * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (bVar9 = false, dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar10 = (int)dVar4;
        }
        local_a8.red_X = iVar10;
        iVar12 = 0;
        if (uVar6._4_4_ != 0) {
          dVar4 = floor(((double)uVar6._4_4_ * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar12 = (int)dVar4;
        }
        iVar10 = 0;
        local_a8.red_Y = iVar12;
        if (local_a8.red_Z != 0) {
          dVar4 = floor(((double)local_a8.red_Z * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar10 = (int)dVar4;
        }
        local_a8.red_Z = iVar10;
        iVar10 = 0;
        iVar12 = 0;
        if (local_a8.green_X != 0) {
          dVar4 = floor(((double)local_a8.green_X * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar12 = (int)dVar4;
        }
        local_a8.green_X = iVar12;
        if ((png_fixed_point)uVar7 != 0) {
          dVar4 = floor(((double)(png_fixed_point)uVar7 * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar10 = (int)dVar4;
        }
        local_a8.green_Y = iVar10;
        iVar10 = 0;
        iVar12 = 0;
        if (local_a8.green_Z != 0) {
          dVar4 = floor(((double)local_a8.green_Z * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar12 = (int)dVar4;
        }
        local_a8.green_Z = iVar12;
        if (local_a8.blue_X != 0) {
          dVar4 = floor(((double)local_a8.blue_X * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar10 = (int)dVar4;
        }
        local_a8.blue_X = iVar10;
        pVar13 = 0;
        iVar12 = 0;
        if (uVar8._4_4_ != 0) {
          dVar4 = floor(((double)uVar8._4_4_ * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar4) || (dVar4 < -2147483648.0)) goto LAB_0010c166;
          iVar12 = (int)dVar4;
        }
        local_a8.blue_Y = iVar12;
        if (local_a8.blue_Z != 0) {
          dVar5 = floor(((double)local_a8.blue_Z * 100000.0) / dVar5 + 0.5);
          bVar9 = false;
          if ((2147483647.0 < dVar5) || (dVar5 < -2147483648.0)) goto LAB_0010c166;
          pVar13 = (png_fixed_point)dVar5;
        }
        iVar11 = 0;
        bVar9 = true;
        local_a8.blue_Z = pVar13;
      }
    }
  }
LAB_0010c166:
  if (bVar9) {
    iVar12 = png_xy_from_XYZ(&local_78,&local_a8);
    iVar11 = 1;
    if (iVar12 == 0) {
      local_58.blue_Z = local_a8.blue_Z;
      local_58.green_Y = local_a8.green_Y;
      local_58.green_Z = local_a8.green_Z;
      local_58.blue_X = local_a8.blue_X;
      local_58.blue_Y = local_a8.blue_Y;
      local_58.red_X = local_a8.red_X;
      local_58.red_Y = local_a8.red_Y;
      local_58.red_Z = local_a8.red_Z;
      local_58.green_X = local_a8.green_X;
      iVar11 = png_colorspace_check_xy(&local_58,&local_78);
    }
  }
  if (iVar11 == 1) {
    pbVar1 = (byte *)((long)&colorspace->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    png_benign_error(png_ptr,"invalid end points");
    iVar12 = 0;
  }
  else {
    if (iVar11 != 0) {
      pbVar1 = (byte *)((long)&colorspace->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      png_error(png_ptr,"internal error checking chromaticities");
    }
    iVar12 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,&local_78,&local_a8,local_7c);
  }
  return iVar12;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}